

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# greg.c
# Opt level: O1

int yy_grammar(GREG *G)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int extraout_EAX;
  int iVar5;
  int iVar6;
  int yypos121;
  int yythunkpos121;
  int iVar7;
  int yythunkpos0;
  int iVar8;
  
  iVar7 = G->pos;
  iVar8 = G->thunkpos;
  yy__(G);
  iVar3 = G->pos;
  iVar1 = G->thunkpos;
  iVar2 = yy_declaration(G);
  if (iVar2 == 0) {
    G->pos = iVar3;
    G->thunkpos = iVar1;
    iVar3 = yy_definition(G);
    if (iVar3 == 0) {
      iVar2 = 0;
      goto LAB_001027c4;
    }
  }
  do {
    iVar3 = G->pos;
    iVar1 = G->thunkpos;
    iVar2 = yy_declaration(G);
    iVar5 = 7;
    if (iVar2 == 0) {
      G->pos = iVar3;
      G->thunkpos = iVar1;
      iVar2 = yy_definition(G);
      iVar5 = (uint)(iVar2 == 0) << 3;
    }
    if (iVar5 == 0) {
LAB_001026c8:
      iVar5 = 5;
    }
    else if (iVar5 == 8) {
      G->pos = iVar3;
      G->thunkpos = iVar1;
      iVar5 = 0;
    }
    else if (iVar5 == 7) goto LAB_001026c8;
  } while (iVar5 != 0);
  iVar3 = G->pos;
  iVar1 = G->thunkpos;
  iVar2 = yymatchString(G,"%%");
  if (iVar2 != 0) {
    yyText(G,G->begin,G->end);
    G->begin = G->pos;
    do {
      iVar5 = G->pos;
      if (G->limit <= iVar5) {
        iVar6 = G->thunkpos;
        iVar4 = yyrefill(G);
        if (iVar4 == 0) goto LAB_00102730;
      }
      G->pos = G->pos + 1;
    } while( true );
  }
  G->pos = iVar3;
  G->thunkpos = iVar1;
  iVar5 = 0;
  goto LAB_0010276f;
LAB_00102730:
  G->pos = iVar5;
  G->thunkpos = iVar6;
  yyText(G,G->begin,G->end);
  G->end = G->pos;
  yyDo(G,yy_1_trailer,G->begin,G->pos,"yy_1_trailer");
  iVar5 = extraout_EAX;
LAB_0010276f:
  iVar6 = 10;
  if (iVar2 == 0) {
    G->pos = iVar3;
    G->thunkpos = iVar1;
    iVar6 = 0;
  }
  if ((iVar6 != 10) && (iVar6 != 0)) {
    return iVar5;
  }
  iVar3 = G->pos;
  iVar1 = G->thunkpos;
  if ((iVar3 < G->limit) || (iVar2 = yyrefill(G), iVar2 != 0)) {
    G->pos = iVar3;
    G->thunkpos = iVar1;
    iVar2 = 0;
  }
  else {
    iVar2 = 1;
    iVar7 = iVar3;
    iVar8 = iVar1;
  }
LAB_001027c4:
  G->pos = iVar7;
  G->thunkpos = iVar8;
  return iVar2;
}

Assistant:

YY_RULE(int) yy_grammar(GREG *G)
{  int yypos0= G->pos, yythunkpos0= G->thunkpos;  yyprintfv((stderr, "%s\n", "grammar"));
  if (!yy__(G))  goto l116;

  {  int yypos119= G->pos, yythunkpos119= G->thunkpos;  if (!yy_declaration(G))  goto l120;
  goto l119;
  l120:;	  G->pos= yypos119; G->thunkpos= yythunkpos119;  if (!yy_definition(G))  goto l116;

  }
  l119:;	
  l117:;	
  {  int yypos118= G->pos, yythunkpos118= G->thunkpos;
  {  int yypos121= G->pos, yythunkpos121= G->thunkpos;  if (!yy_declaration(G))  goto l122;
  goto l121;
  l122:;	  G->pos= yypos121; G->thunkpos= yythunkpos121;  if (!yy_definition(G))  goto l118;

  }
  l121:;	  goto l117;
  l118:;	  G->pos= yypos118; G->thunkpos= yythunkpos118;
  }
  {  int yypos123= G->pos, yythunkpos123= G->thunkpos;  if (!yy_trailer(G))  goto l123;
  goto l124;
  l123:;	  G->pos= yypos123; G->thunkpos= yythunkpos123;
  }
  l124:;	  if (!yy_end_of_file(G))  goto l116;
  yyprintf((stderr, "  ok   grammar"));
  yyprintfGcontext;
  yyprintf((stderr, "\n"));

  return 1;
  l116:;	  G->pos= yypos0; G->thunkpos= yythunkpos0;  yyprintfv((stderr, "  fail %s", "grammar"));
  yyprintfvGcontext;
  yyprintfv((stderr, "\n"));

  return 0;
}